

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ags_t AGSSock::Socket_SendTo(Socket *sock,SockAddr *addr,char *str)

{
  size_t count;
  ags_t aVar1;
  
  count = strlen(str);
  aVar1 = sendto_impl(sock,addr,str,count);
  return aVar1;
}

Assistant:

ags_t Socket_SendTo(Socket *sock, const SockAddr *addr, const char *str)
{
	return sendto_impl(sock, addr, str, strlen(str));
}